

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::OnBlock(SharedValidator *this,Location *loc,Type sig_type)

{
  Result RVar1;
  Result RVar2;
  TypeVector result_types;
  TypeVector param_types;
  
  param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->expr_loc_ = loc;
  RVar1 = CheckBlockSignature(this,loc,(Opcode)0x2,sig_type,
                              (TypeVector *)
                              &param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>,
                              &result_types);
  RVar2 = TypeChecker::OnBlock
                    (&this->typechecker_,
                     (TypeVector *)
                     &param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>,
                     &result_types);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result SharedValidator::OnBlock(const Location& loc, Type sig_type) {
  Result result = Result::Ok;
  TypeVector param_types, result_types;
  expr_loc_ = &loc;
  result |= CheckBlockSignature(loc, Opcode::Block, sig_type, &param_types,
                                &result_types);
  result |= typechecker_.OnBlock(param_types, result_types);
  return result;
}